

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionEngine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::run(ExecutionEngine *this)

{
  int iVar1;
  _Elt_pointer paVar2;
  long lVar3;
  long lVar4;
  Value v;
  anon_struct_16_2_93c6670d local_30;
  
  if (0 < r.inSize) {
    lVar4 = 0;
    do {
      paVar2 = vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data
               ._M_finish._M_cur;
      iVar1 = r.instr[lVar4];
      if (iVar1 == 0xf) {
        lVar3 = (long)counter;
        counter = counter + 1;
        local_30.v = r.Consts[lVar3].v;
        local_30.field_1 =
             *(anon_union_8_3_805d2717_for_anon_struct_16_2_93c6670d_1 *)&r.Consts[lVar3].field_1;
        if (vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_last + -1) {
          std::deque<Value,_std::allocator<Value>_>::_M_push_back_aux<Value>(&vst.c,&local_30);
        }
        else {
          *(ulong *)vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur = CONCAT44(local_30._4_4_,local_30.v);
          paVar2->field_1 = local_30.field_1;
          vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur =
               vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data
               ._M_finish._M_cur + 1;
        }
      }
      else if (iVar1 == 0x10) {
        if (vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          paVar2 = vst.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        v._4_4_ = 0;
        v.v = paVar2[-1].v;
        v.field_1.cval = paVar2[-1].field_1.cval;
        printVal(v);
        std::deque<Value,_std::allocator<Value>_>::pop_back(&vst.c);
      }
      else if (iVar1 == 0x11) {
        exit(0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < r.inSize);
  }
  return;
}

Assistant:

void ExecutionEngine::run() {
  for(int i = 0; i < r.inSize; i++) {
    switch(r.instr[i]) {
      case OP_PRINT:
      printVal(vst.top());
      vst.pop();
      break;
      case OP_LOAD:
      vst.emplace(getCon());
      break;
      case OP_RETURN:
      exit(0);
      break;
    }
  }
}